

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O1

bool __thiscall ON_Brep::RemoveSlits(ON_Brep *this)

{
  ON_BrepFace *pOVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  
  if ((this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count < 1) {
    bVar3 = false;
  }
  else {
    lVar5 = 0;
    uVar4 = 0;
    bVar3 = false;
    do {
      pOVar1 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
      if ((uVar4 == *(uint *)((pOVar1->m_face_uuid).Data4 + lVar5 + -0x30)) &&
         (bVar2 = RemoveSlits(this,(ON_BrepFace *)((pOVar1->m_face_uuid).Data4 + lVar5 + -0x5c)),
         bVar2)) {
        bVar3 = true;
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0xd8;
    } while ((long)uVar4 <
             (long)(this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                   m_count);
  }
  return bVar3;
}

Assistant:

bool ON_Brep::RemoveSlits()

{
  bool rc = false;
  int i;
  for (i=0; i<m_F.Count(); i++){
    ON_BrepFace& F = m_F[i];
    if (F.m_face_index != i) continue;
    if (RemoveSlits(F))
      rc = true;
  }
  return rc;
}